

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_input.cpp
# Opt level: O2

void I_StartTic(void)

{
  long lVar1;
  bool bVar2;
  
  if (menuactive == MENU_Off) {
    bVar2 = chatmodeon != 0 || ConsoleState - c_down < 2;
  }
  else {
    bVar2 = (menuactive & ~MENU_WaitKey) == MENU_On;
  }
  if ((GUICapture != bVar2) && (GUICapture = bVar2, bVar2 != false)) {
    memset(DownState,0,0x200);
  }
  lVar1 = SDL_GetKeyboardFocus();
  bVar2 = true;
  if ((((lVar1 != 0) && (use_mouse.Value == true)) && (GUICapture == false)) &&
     ((paused == 0 && (demoplayback == false)))) {
    if (mouse_capturemode.Value == 1) {
      bVar2 = (uint)gamestate < 3;
    }
    else if (mouse_capturemode.Value != 2) {
      bVar2 = gamestate == GS_LEVEL;
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (NativeMouse != bVar2) {
    NativeMouse = bVar2;
    SDL_ShowCursor(bVar2);
    if (bVar2 == false) {
      I_SetMouseCapture();
    }
  }
  I_GetEvent();
  return;
}

Assistant:

static void I_CheckGUICapture ()
{
	bool wantCapt;

	if (menuactive == MENU_Off)
	{
		wantCapt = ConsoleState == c_down || ConsoleState == c_falling || chatmodeon;
	}
	else
	{
		wantCapt = (menuactive == MENU_On || menuactive == MENU_OnNoPause);
	}

	if (wantCapt != GUICapture)
	{
		GUICapture = wantCapt;
		if (wantCapt)
		{
			memset (DownState, 0, sizeof(DownState));
		}
	}
}